

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::CompLayer::renderHelper
          (CompLayer *this,VPainter *painter,VRle *inheritMask,VRle *matteRle,SurfaceCache *cache)

{
  bool bVar1;
  reference ppLVar2;
  VRect *in_RCX;
  LayerMask *in_RDX;
  undefined8 in_RSI;
  Layer *in_RDI;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *in_R8;
  Layer **layer;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *__range1;
  Layer *matte;
  VRle mask;
  Layer *in_stack_00000258;
  Layer *in_stack_00000260;
  VRle *in_stack_00000268;
  VRle *in_stack_00000270;
  VPainter *in_stack_00000278;
  CompLayer *in_stack_00000280;
  SurfaceCache *in_stack_00000290;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  *in_stack_ffffffffffffff60;
  Clipper *in_stack_ffffffffffffff78;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  local_78;
  Layer *local_70;
  Layer *local_68;
  VRle *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_30 [8];
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *local_28;
  
  local_28 = in_R8;
  VRle::VRle((VRle *)0x1601b6);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                      *)0x1601c4);
  if (bVar1) {
    std::
    unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
    ::operator->((unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                  *)0x1601db);
    VPainter::clipBoundingRect((VPainter *)0x1601ed);
    LayerMask::maskRle(in_RDX,in_RCX);
    VRle::operator=((VRle *)in_stack_ffffffffffffff60,(VRle *)in_stack_ffffffffffffff58);
    VRle::~VRle((VRle *)0x160224);
    bVar1 = VRle::empty((VRle *)0x160231);
    if (!bVar1) {
      VRle::operator&((VRle *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa0);
      VRle::operator=((VRle *)in_stack_ffffffffffffff60,(VRle *)in_stack_ffffffffffffff58);
      VRle::~VRle((VRle *)0x160265);
    }
    bVar1 = VRle::empty((VRle *)0x16026f);
    if (bVar1) goto LAB_00160437;
  }
  else {
    VRle::operator=((VRle *)in_stack_ffffffffffffff60,(VRle *)in_stack_ffffffffffffff58);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                      *)0x1602a4);
  if (bVar1) {
    std::
    unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
    ::operator->((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                  *)0x1602b8);
    Clipper::rle(in_stack_ffffffffffffff78,(VRle *)in_RDI);
    VRle::operator=((VRle *)in_stack_ffffffffffffff60,(VRle *)in_stack_ffffffffffffff58);
    VRle::~VRle((VRle *)0x1602e3);
    bVar1 = VRle::empty((VRle *)0x1602ed);
    if (bVar1) goto LAB_00160437;
  }
  local_68 = (Layer *)0x0;
  local_70 = in_RDI + 1;
  local_78._M_current =
       (Layer **)
       std::
       vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
       ::begin(in_stack_ffffffffffffff58);
  std::
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ::end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff60,
                            (__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    ppLVar2 = __gnu_cxx::
              __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
              ::operator*(&local_78);
    bVar1 = Layer::hasMatte(*ppLVar2);
    if (bVar1) {
      local_68 = *ppLVar2;
    }
    else {
      bVar1 = Layer::visible(in_RDI);
      if (bVar1) {
        if (local_68 == (Layer *)0x0) {
          (*(*ppLVar2)->_vptr_Layer[4])(*ppLVar2,in_RSI,local_30,in_RCX,local_28);
        }
        else {
          bVar1 = Layer::visible(in_RDI);
          if (bVar1) {
            in_stack_ffffffffffffff58 = local_28;
            renderMatteLayer(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268
                             ,in_stack_00000260,in_stack_00000258,in_stack_00000290);
          }
        }
      }
      local_68 = (Layer *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
    ::operator++(&local_78);
  }
LAB_00160437:
  VRle::~VRle((VRle *)0x160441);
  return;
}

Assistant:

void renderer::CompLayer::renderHelper(VPainter *    painter,
                                       const VRle &  inheritMask,
                                       const VRle &  matteRle,
                                       SurfaceCache &cache)
{
    VRle mask;
    if (mLayerMask) {
        mask = mLayerMask->maskRle(painter->clipBoundingRect());
        if (!inheritMask.empty()) mask = mask & inheritMask;
        // if resulting mask is empty then return.
        if (mask.empty()) return;
    } else {
        mask = inheritMask;
    }

    if (mClipper) {
        mask = mClipper->rle(mask);
        if (mask.empty()) return;
    }

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible())
                        renderMatteLayer(painter, mask, matteRle, matte, layer,
                                         cache);
                } else {
                    layer->render(painter, mask, matteRle, cache);
                }
            }
            matte = nullptr;
        }
    }
}